

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

void addTests_Image_Function(UnitTestFramework *framework)

{
  UnitTestFramework *in_stack_00000028;
  FunctionRegistrator *in_stack_00000030;
  
  anon_unknown.dwarf_1bd17c::FunctionRegistrator::instance();
  anon_unknown.dwarf_1bd17c::FunctionRegistrator::set(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

void addTests_Image_Function( UnitTestFramework & framework )
{
    FunctionRegistrator::instance().set( framework );
}